

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
               (Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *lhs,
               Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *rhs,
               Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *dest,Scalar *alpha)

{
  long lVar1;
  ScalarWithConstIfNotLvalue *res;
  float *ptr;
  size_t size;
  Index rows;
  TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *pTVar2;
  Index cols;
  MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0> *this;
  ulong uVar3;
  Scalar *pSVar4;
  Index IVar5;
  Index resIncr;
  ScalarWithConstIfNotLvalue **ppSVar6;
  Scalar SVar7;
  Scalar SVar8;
  float alpha_00;
  ScalarWithConstIfNotLvalue *local_1f8;
  float *local_1f0;
  size_t local_1e8;
  Index local_1e0;
  TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *local_1d8;
  Index local_1d0;
  Scalar *local_1c8;
  float *local_1c0;
  Scalar *local_1b8;
  Scalar *local_1b0;
  float local_1a8;
  float local_1a4;
  BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true,_true>
  local_1a0;
  const_blas_data_mapper<float,_long,_0> local_138 [2];
  const_blas_data_mapper<float,_long,_1> local_118;
  undefined1 local_108 [8];
  aligned_stack_memory_handler<float> actualRhsPtr_stack_memory_destructor;
  RhsScalar *actualRhsPtr;
  gemv_static_vector_if<float,__1,__1,_false> static_rhs;
  ResScalar actualAlpha;
  type actualRhs;
  type actualLhs;
  Scalar *alpha_local;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *dest_local;
  Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *rhs_local;
  Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *lhs_local;
  
  ppSVar6 = &local_1f8;
  actualLhs.m_matrix = (non_const_type)alpha;
  actualRhs = (type)blas_traits<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>::
                    extract(lhs);
  this = (MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0> *)
         blas_traits<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
         extract(rhs);
  local_1a8 = *(float *)&((actualLhs.m_matrix)->
                         super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                         m_data;
  SVar7 = blas_traits<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>::
          extractScalarFactor(lhs);
  local_1a4 = local_1a8 * SVar7;
  SVar8 = blas_traits<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
          extractScalarFactor(rhs);
  alpha_00 = local_1a4 * SVar8;
  uVar3 = EigenBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::size
                    ((EigenBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)this);
  if (0x3fffffffffffffff < uVar3) {
    throw_std_bad_alloc();
  }
  pSVar4 = MapBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>::
           data(this);
  if (pSVar4 == (Scalar *)0x0) {
    IVar5 = EigenBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
            size((EigenBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                  *)this);
    if ((ulong)(IVar5 * 4) < 0x20001) {
      IVar5 = EigenBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
              size((EigenBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)this);
      lVar1 = -(IVar5 * 4 + 0x1eU & 0xfffffffffffffff0);
      ppSVar6 = (ScalarWithConstIfNotLvalue **)((long)&local_1f8 + lVar1);
      local_1b8 = (Scalar *)((long)&local_1f0 + lVar1);
    }
    else {
      IVar5 = EigenBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
              size((EigenBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)this);
      local_1b8 = (Scalar *)aligned_malloc(IVar5 << 2);
    }
    local_1b0 = local_1b8;
  }
  else {
    local_1b0 = MapBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>
                ::data(this);
    ppSVar6 = &local_1f8;
  }
  actualRhsPtr_stack_memory_destructor._16_8_ = local_1b0;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f19d;
  pSVar4 = MapBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>::
           data(this);
  if (pSVar4 == (Scalar *)0x0) {
    local_1c0 = (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_1c0 = (float *)0x0;
  }
  local_1f0 = local_1c0;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f1d8;
  local_1e8 = EigenBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
              size((EigenBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)this);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f1eb;
  IVar5 = EigenBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::size
                    ((EigenBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)this);
  size = local_1e8;
  ptr = local_1f0;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f215;
  aligned_stack_memory_handler<float>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_108,ptr,size,0x20000 < (ulong)(IVar5 << 2)
            );
  local_1d8 = (TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *)
              &actualRhs;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f228;
  local_1e0 = Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&actualRhs);
  pTVar2 = local_1d8;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f23b;
  local_1d0 = Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)pTVar2);
  pTVar2 = local_1d8;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f24e;
  local_1c8 = TransposeImpl<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::data
                        (pTVar2);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f263;
  local_118.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_stride =
       TransposeImpl<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::outerStride
                 ((TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *)
                  &actualRhs);
  local_118.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_data = local_1c8;
  local_138[0].super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
       (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  local_138[0].super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = 1;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f375;
  local_1f8 = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::data
                        ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                          *)dest);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f393;
  DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::col
            ((ColXpr *)&local_1a0,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)dest,
             0);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f3a1;
  resIncr = BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_true,_true>
            ::innerStride(&local_1a0);
  cols = local_1d0;
  rows = local_1e0;
  res = local_1f8;
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f3d4;
  general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
  ::run(rows,cols,&local_118,local_138,res,resIncr,alpha_00);
  *(undefined8 *)((long)ppSVar6 + -8) = 0x23f3e2;
  aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_108);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }